

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O1

t_object * __thiscall
xemmai::t_engine::f_new_type_on_boot<xemmai::t_native>
          (t_engine *this,size_t a_fields,t_type *a_super,t_object *a_module)

{
  t_type *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  t_object *ptVar2;
  long in_FS_OFFSET;
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  local_78;
  _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  local_58;
  
  ptVar2 = f_allocate_for_type<xemmai::t_type_of<xemmai::t_native>>(this,a_fields);
  local_78.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl._0_8_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  t_type_of<xemmai::t_object>::t_type_of<2ul>
            ((t_type_of<xemmai::t_object> *)ptVar2->v_data,
             &t_bears<xemmai::t_native,_xemmai::t_type_of<xemmai::t_object>_>::c_IDS,a_super,
             a_module,0x10,0,&local_78,
             (map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
              *)&local_58);
  ptVar2[1].v_cyclic = (size_t)t_type_of<xemmai::t_native>::f_do_scan;
  *(code **)ptVar2[1].v_data =
       t_uninstantiatable<xemmai::t_holds<xemmai::t_native,_xemmai::t_type_of<xemmai::t_object>_>_>
       ::f_do_instantiate;
  ptVar2[1].v_data[8] = '\0';
  ptVar2[1].v_data[9] = '\0';
  ptVar2[1].v_data[10] = '\0';
  ptVar2[1].v_data[0xb] = '\0';
  ptVar2[1].v_data[0xc] = '\0';
  ptVar2[1].v_data[0xd] = '\0';
  ptVar2[1].v_data[0xe] = '\0';
  ptVar2[1].v_data[0xf] = '\0';
  ptVar2[2].v_next = (t_object *)t_type_of<xemmai::t_native>::f_do_call;
  *(code **)&ptVar2[2].v_color = t_type_of<xemmai::t_native>::f_do_get_at;
  ptVar2[1].v_rank =
       (size_t)t_finalizes<xemmai::t_bears<xemmai::t_native,_xemmai::t_type_of<xemmai::t_object>_>_>
               ::f_do_finalize;
  if (a_fields != 0) {
    memset(&ptVar2[3].v_type,0,a_fields * 0x18);
  }
  std::
  _Rb_tree<xemmai::t_object_*,_std::pair<xemmai::t_object_*const,_unsigned_long>,_std::_Select1st<std::pair<xemmai::t_object_*const,_unsigned_long>_>,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  ::~_Rb_tree(&local_58);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector(&local_78);
  ptVar1 = this->v_type_type;
  this_00 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_00->v_head = (t_object *)&ptVar1[-1].f_less;
  if (this_00->v_head == this_00->v_next) {
    t_slot::t_queue<128UL>::f_next(this_00);
  }
  else {
    this_00->v_head = this_00->v_head + 1;
  }
  ptVar2->v_type = ptVar1;
  this_01 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_01->v_head = ptVar2;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<256UL>::f_next(this_01);
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  return ptVar2;
}

Assistant:

t_object* f_new_type_on_boot(size_t a_fields, t_type* a_super, t_object* a_module)
	{
		auto p = f_allocate_for_type<t_type_of<T>>(a_fields);
		std::uninitialized_default_construct_n((new(p->f_data()) t_type_of<T>(t_type_of<T>::c_IDS, a_super, a_module, t_type_of<T>::c_NATIVE, 0, std::vector<std::pair<t_root, t_rvalue>>{}, std::map<t_object*, size_t>{}))->f_fields(), a_fields);
		p->f_be(v_type_type);
		return p;
	}